

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void super_(_Bool canAssign)

{
  Token name;
  Token name_00;
  Token name_01;
  uint8_t byte2;
  uint8_t byte;
  ObjString *pOVar1;
  char *message;
  Token token_1;
  Token token_2;
  Token token;
  undefined8 local_58;
  undefined4 uStack_44;
  undefined8 local_40;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_14;
  
  if (currentClass == (ClassCompiler *)0x0) {
    message = "Cannot use \'super\' outside of a class.";
  }
  else {
    if (currentClass->hasSuperclass != false) goto LAB_001046ab;
    message = "Cannot use \'super\' in a class with no superclass.";
  }
  errorAt(&parser.previous,message);
LAB_001046ab:
  if (parser.current.type == TOKEN_DOT) {
    advance();
  }
  else {
    errorAt(&parser.current,"Expect \'.\' after \'super\'.");
  }
  if (parser.current.type == TOKEN_IDENTIFIER) {
    advance();
  }
  else {
    errorAt(&parser.current,"Expect superclass method name.");
  }
  pOVar1 = copyString(parser.previous.start,parser.previous.length);
  byte2 = makeConstant((ulong)pOVar1 | 0xfffc000000000000);
  name.line = uStack_14;
  name.length = 4;
  name.start = "this";
  name._0_8_ = local_28;
  namedVariable(name,false);
  if (parser.current.type != TOKEN_LEFT_PAREN) {
    name_00.line = uStack_44;
    name_00.length = 5;
    name_00.start = "super";
    name_00._0_8_ = local_58;
    namedVariable(name_00,false);
    emitBytes('\x0e',byte2);
    return;
  }
  advance();
  byte = argumentList();
  name_01.line = uStack_2c;
  name_01.length = 5;
  name_01.start = "super";
  name_01._0_8_ = local_40;
  namedVariable(name_01,false);
  emitBytes('\x1e',byte2);
  writeChunk(&current->function->chunk,byte,parser.previous.line);
  return;
}

Assistant:

static void super_(bool canAssign) {
    if (currentClass == NULL) {
        error("Cannot use 'super' outside of a class.");
    } else if (!currentClass->hasSuperclass) {
        error("Cannot use 'super' in a class with no superclass.");
    }

    consume(TOKEN_DOT, "Expect '.' after 'super'.");
    consume(TOKEN_IDENTIFIER, "Expect superclass method name.");
    uint8_t name = identifierConstant(&parser.previous);

    namedVariable(syntheticToken("this"), false);

    if (match(TOKEN_LEFT_PAREN)) {
        uint8_t argCount = argumentList();
        namedVariable(syntheticToken("super"), false);
        emitBytes(OP_SUPER_INVOKE, name);
        emitByte(argCount);
    } else {
        namedVariable(syntheticToken("super"), false);
        emitBytes(OP_GET_SUPER, name);
    }
}